

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkHeader.cpp
# Opt level: O1

void __thiscall
ShellLinkHeader::fillShellLinkHeader
          (ShellLinkHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *header)

{
  uchar *__first;
  
  __first = (header->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first,__first + 4,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)this);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 4,__first + 0x14,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->LinkCLSID);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x14,__first + 0x18,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->LinkFlags);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x18,__first + 0x1c,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->FileAttributes);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x1c,__first + 0x24,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->CreationTime);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x24,__first + 0x2c,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->AccessTime);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x2c,__first + 0x34,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->WriteTime);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x34,__first + 0x38,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->FileSize);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x38,__first + 0x3c,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->IconIndex);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x3c,__first + 0x40,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->ShowCommand);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x40,__first + 0x42,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->HotKey);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x42,__first + 0x44,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->Reserved1);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x44,__first + 0x48,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->Reserved2);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            (__first + 0x48,__first + 0x4c,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             &this->Reserved3);
  reverseAllFields(this);
  return;
}

Assistant:

void ShellLinkHeader::fillShellLinkHeader(std::vector<unsigned char> header) {
        /* Fill all field */
        auto it = header.begin();

        std::copy(it, it + 4, std::back_inserter(HeaderSize));              // 4 byte
        it = it + 4;
        std::copy(it, it + 16, std::back_inserter(LinkCLSID));              // 16 byte
        it = it + 16;
        std::copy(it, it + 4, std::back_inserter(LinkFlags));               // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(FileAttributes));          // 4 byte
        it = it + 4;
        std::copy(it, it + 8, std::back_inserter(CreationTime));            // 8 byte
        it = it + 8;
        std::copy(it, it + 8, std::back_inserter(AccessTime));              // 8 byte
        it = it + 8;
        std::copy(it, it + 8, std::back_inserter(WriteTime));               // 8 byte
        it = it + 8;
        std::copy(it, it + 4, std::back_inserter(FileSize));                // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(IconIndex));               // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(ShowCommand));             // 4 byte
        it = it + 4;
        std::copy(it, it + 2, std::back_inserter(HotKey));                  // 2 byte
        it = it + 2;
        std::copy(it, it + 2, std::back_inserter(Reserved1));               // 2 byte
        it = it + 2;
        std::copy(it, it + 4, std::back_inserter(Reserved2));               // 4 byte
        it = it + 4;
        std::copy(it, it + 4, std::back_inserter(Reserved3));               // 4 byte

        /* Reverse All field (read left -> rigth) */
        ShellLinkHeader::reverseAllFields();
    }